

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase420::run(TestCase420 *this)

{
  Reader reader_00;
  bool bVar1;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> AVar2;
  ReaderOptions options;
  size_t in_stack_fffffffffffffbd8;
  Reader local_3d8;
  ArrayPtr<capnp::word> local_3a8;
  ReaderOptions local_398;
  undefined1 local_380 [8];
  PackedMessageReader reader;
  size_t local_238;
  size_t local_230;
  bool local_221;
  undefined1 auStack_220 [7];
  bool _kj_shouldLog;
  size_t local_218;
  size_t local_210;
  size_t local_208;
  DebugExpression<unsigned_long> local_200;
  undefined1 local_1f8 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  TestPipe pipe;
  Builder local_158;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase420 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,3);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_158,(MessageBuilder *)local_108);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_130,&local_158);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)&pipe.readPos,&local_130);
  TestPipe::TestPipe((TestPipe *)&_kjCondition.result);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_108);
  local_208 = computeSerializedSizeInWords((MessageBuilder *)local_108);
  local_200 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_208);
  _auStack_220 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
  AVar2.size_ = (uchar *)auStack_220._8_8_;
  AVar2.ptr = AVar2.size_;
  local_210 = computeUnpackedSizeInWords((capnp *)auStack_220._0_8_,AVar2);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_1f8,&local_200,&local_210);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
  if (!bVar1) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      local_230 = computeSerializedSizeInWords((MessageBuilder *)local_108);
      AVar2 = TestPipe::getArray((TestPipe *)&_kjCondition.result);
      packedBytes.size_ = (uchar *)AVar2.size_;
      reader.super_InputStreamMessageReader._288_8_ = AVar2.ptr;
      packedBytes.ptr = packedBytes.size_;
      in_stack_fffffffffffffbd8 =
           computeUnpackedSizeInWords
                     ((capnp *)reader.super_InputStreamMessageReader._288_8_,packedBytes);
      local_238 = in_stack_fffffffffffffbd8;
      kj::_::Debug::
      log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x1ab,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_1f8,&local_230,&local_238);
      local_221 = false;
    }
  }
  local_398.traversalLimitInWords = 0;
  local_398.nestingLimit = 0;
  local_398._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_398);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_3a8,(void *)0x0);
  options.nestingLimit = local_398.nestingLimit;
  options.traversalLimitInWords = local_398.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_380,(BufferedInputStream *)&_kjCondition.result,options,
             local_3a8);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_3d8,(MessageReader *)&reader.super_PackedInputStream.inner);
  reader_00._reader.capTable = (CapTableReader *)local_3d8._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_3d8._reader.capTable;
  reader_00._reader.data = local_3d8._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_3d8._reader._32_8_;
  reader_00._reader.dataSize = local_3d8._reader.nestingLimit;
  reader_00._reader.pointerCount = local_3d8._reader._44_2_;
  reader_00._reader._38_2_ = local_3d8._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffbd8;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_380);
  TestPipe::~TestPipe((TestPipe *)&_kjCondition.result);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroOddSegmentCount) {
  TestMessageBuilder builder(3);
  builder.initRoot<TestAllTypes>().initStructField().initStructField();

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}